

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O1

bool vera::loadOBJ(string *_filename,Mesh *_mesh)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  pointer puVar5;
  char *__s;
  _Base_ptr p_Var6;
  ulong uVar7;
  bool bVar8;
  ostream *poVar9;
  pointer paVar10;
  _Base_ptr p_Var11;
  mapped_type *_normal;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  _Rb_tree_header *p_Var15;
  ulong uVar16;
  bool bVar17;
  int vi;
  unsigned_long local_1c0;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  string name;
  vec4 local_178;
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  smoothVertexNormals;
  string err;
  string warn;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  string base_dir;
  attrib_t attrib;
  
  memset(&attrib,0,0x90);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&smoothVertexNormals,(_filename->_M_dataplus)._M_p,(allocator *)&name);
  getBaseDir(&base_dir,(string *)&smoothVertexNormals);
  if ((_Base_ptr *)smoothVertexNormals._M_t._M_impl._0_8_ !=
      &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)smoothVertexNormals._M_t._M_impl._0_8_);
  }
  bVar8 = tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&err,(_filename->_M_dataplus)._M_p,
                           base_dir._M_dataplus._M_p,true,true);
  if (warn._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WARN: ",6);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,warn._M_dataplus._M_p,warn._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if (err._M_string_length != 0) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,err._M_dataplus._M_p,err._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if (bVar8) {
    local_1c0 = 0;
    if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      p_Var1 = &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header;
      do {
        name._M_dataplus._M_p = (pointer)&name.field_2;
        pcVar4 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_1c0].name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&name,pcVar4,
                   pcVar4 + shapes.
                            super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_1c0].name.
                            _M_string_length);
        if (name._M_string_length == 0) {
          toString<unsigned_long>((string *)&smoothVertexNormals,&local_1c0);
          std::__cxx11::string::operator=((string *)&name,(string *)&smoothVertexNormals);
          if ((_Base_ptr *)smoothVertexNormals._M_t._M_impl._0_8_ !=
              &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)smoothVertexNormals._M_t._M_impl._0_8_);
          }
        }
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        puVar5 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_1c0].mesh.smoothing_group_ids.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = (long)shapes.
                       super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                       _M_impl.super__Vector_impl_data._M_start[local_1c0].mesh.smoothing_group_ids.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar5;
        bVar17 = lVar13 != 0;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        if (lVar13 == 0) {
LAB_002b8c5d:
          if (bVar17) goto LAB_002b8c62;
        }
        else {
          uVar14 = lVar13 >> 2;
          if (*puVar5 == 0) {
            uVar7 = 1;
            do {
              uVar16 = uVar7;
              if (uVar14 + (uVar14 == 0) == uVar16) break;
              uVar7 = uVar16 + 1;
            } while (puVar5[uVar16] == 0);
            bVar17 = uVar16 < uVar14;
            goto LAB_002b8c5d;
          }
LAB_002b8c62:
          computeSmoothingNormals
                    (&attrib,shapes.
                             super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_1c0,
                     &smoothVertexNormals);
        }
        paVar10 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_1c0].mesh.indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
            super__Vector_impl_data._M_start[local_1c0].mesh.indices.
            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar10) {
          uVar14 = 0;
          do {
            vi = paVar10[uVar14].vertex_index;
            iVar2 = paVar10[uVar14].normal_index;
            iVar3 = paVar10[uVar14].texcoord_index;
            local_178.field_2 =
                 *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
                  (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)vi * 3 + 2);
            local_178.field_0 =
                 (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
                 (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)vi * 3)[0];
            local_178.field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
                 (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + (long)vi * 3)[1];
            Mesh::addVertex(_mesh,(vec3 *)&local_178);
            if (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_178.field_0 =
                   (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
                   (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)vi * 3)[0];
              local_178.field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
                   (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)vi * 3)[1];
              local_178.field_2 =
                   *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
                    (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)vi * 3 + 2);
              local_178.field_3.w = 1.0;
              Mesh::addColor(_mesh,&local_178);
            }
            if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) {
              p_Var11 = &p_Var1->_M_header;
              p_Var6 = smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              if (smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                    p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < vi]) {
                  if (vi <= (int)*(size_t *)(p_Var6 + 1)) {
                    p_Var11 = p_Var6;
                  }
                }
                p_Var15 = p_Var1;
                if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
                   (p_Var15 = (_Rb_tree_header *)p_Var11,
                   vi < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
                  p_Var15 = p_Var1;
                }
                if (p_Var15 != p_Var1) {
                  _normal = std::
                            map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                            ::at(&smoothVertexNormals,&vi);
                  Mesh::addNormal(_mesh,_normal);
                }
              }
            }
            else {
              local_178.field_2 =
                   *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
                    (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)iVar2 * 3 + 2);
              local_178.field_0 =
                   (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
                   (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)iVar2 * 3)[0];
              local_178.field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
                   (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)iVar2 * 3)[1];
              Mesh::addNormal(_mesh,(vec3 *)&local_178);
            }
            if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_178.field_1.y =
                   1.0 - attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar3 * 2 + 1];
              local_178.field_0 =
                   *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)
                    (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)iVar3 * 2);
              Mesh::addTexCoord(_mesh,(vec2 *)&local_178);
            }
            Mesh::addIndex(_mesh,(uint32_t)uVar14);
            uVar14 = uVar14 + 1;
            paVar10 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_1c0].mesh.indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar14 < (ulong)(((long)shapes.
                                           super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_1c0].mesh
                                           .indices.
                                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)paVar10 >> 2) * -0x5555555555555555));
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
        ::~_Rb_tree(&smoothVertexNormals._M_t);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p);
        }
        local_1c0 = local_1c0 + 1;
      } while (local_1c0 <
               (ulong)(((long)shapes.
                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)shapes.
                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x6db6db6db6db6db7))
      ;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to load ",0xf);
    __s = (_filename->_M_dataplus)._M_p;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x467ea0);
    }
    else {
      sVar12 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar12);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_dir._M_dataplus._M_p != &base_dir.field_2) {
    operator_delete(base_dir._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err._M_dataplus._M_p != &err.field_2) {
    operator_delete(err._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)warn._M_dataplus._M_p != &warn.field_2) {
    operator_delete(warn._M_dataplus._M_p);
  }
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  if (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool loadOBJ( const std::string& _filename, Mesh& _mesh ) {
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;
    std::string base_dir = getBaseDir(_filename.c_str());
    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, _filename.c_str(), base_dir.c_str());

    if (!warn.empty()) std::cout << "WARN: " << warn << std::endl;
    if (!err.empty()) std::cerr << err << std::endl;
    
    if (!ret) {
        std::cerr << "Failed to load " << _filename.c_str() << std::endl;
        return false;
    }

    for (size_t s = 0; s < shapes.size(); s++) {
        
        std::string name = shapes[s].name;
        if (name.empty())
            name = toString(s);

        // Check for smoothing group and compute smoothing normals
        std::map<int, glm::vec3> smoothVertexNormals;
        if (hasSmoothingGroup(shapes[s]) > 0)
            computeSmoothingNormals(attrib, shapes[s], smoothVertexNormals);

        // std::map<INDEX_TYPE, tinyobj::index_t> unique_indices;
        // std::map<INDEX_TYPE, tinyobj::index_t>::iterator iter;
        
        int mi = -1;
        INDEX_TYPE iCounter = 0;
        for (size_t i = 0; i < shapes[s].mesh.indices.size(); i++) {

            tinyobj::index_t index = shapes[s].mesh.indices[i];
            int vi = index.vertex_index;
            int ni = index.normal_index;
            int ti = index.texcoord_index;

            // // Associate w material with face
            // int f = (int)floor(i/3);
            // if (shapes[s].mesh.material_ids.size() > 0) {
            //     int material_index = shapes[s].mesh.material_ids[f];

            //     // but only when change
            //     if (mi != material_index) {
            //         mi = material_index;
            //         _mesh.addMaterial( InitMaterial( materials[mi] ) );
            //     }
            // }

            // bool reuse = false;
            // iter = unique_indices.find(vi);

            // // if already exist 
            // if (iter != unique_indices.end())
            //     // and have the same attributes
            //     if ((iter->second.normal_index == ni) &&
            //         (iter->second.texcoord_index == ti) )
            //         reuse = true;

            // Re use the vertex
            // if (reuse)
            //     _mesh.addFaceIndex( (INDEX_TYPE)iter->second.vertex_index );

            // // Other wise create a new one
            // else 
            {
                // unique_indices[vi].vertex_index = iCounter;
                // unique_indices[vi].normal_index = ni;
                // unique_indices[vi].texcoord_index = ti;
                
                _mesh.addVertex( getVertex(attrib, vi) );

                if (attrib.colors.size() > 0)
                    _mesh.addColor( getColor(attrib, vi) );

                // If there is normals add them
                if (attrib.normals.size() > 0)
                    _mesh.addNormal( getNormal(attrib, ni) );

                else if (smoothVertexNormals.size() > 0)
                    if ( smoothVertexNormals.find(vi) != smoothVertexNormals.end() )
                        _mesh.addNormal( smoothVertexNormals.at(vi) );

                // If there is texcoords add them
                if (attrib.texcoords.size() > 0)
                    _mesh.addTexCoord( getTexCoords(attrib, ti) );

                // _mesh.addFaceIndex( iCounter );
                // iCounter++;
                _mesh.addIndex(iCounter++);
            }
        }
    }

    return true;
}